

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

void ft_trig_pseudo_rotate(FT_Vector *vec,FT_Angle theta)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  FT_Angle *local_48;
  FT_Angle *arctanptr;
  FT_Fixed b;
  FT_Fixed xtemp;
  FT_Fixed y;
  FT_Fixed x;
  FT_Angle FStack_18;
  FT_Int i;
  FT_Angle theta_local;
  FT_Vector *vec_local;
  
  y = vec->x;
  xtemp = vec->y;
  for (FStack_18 = theta; FStack_18 < -0x2d0000; FStack_18 = FStack_18 + 0x5a0000) {
    lVar1 = -y;
    y = xtemp;
    xtemp = lVar1;
  }
  for (; 0x2d0000 < FStack_18; FStack_18 = FStack_18 + -0x5a0000) {
    lVar1 = -xtemp;
    xtemp = y;
    y = lVar1;
  }
  local_48 = ft_trig_arctan_table;
  arctanptr = (FT_Angle *)0x1;
  for (x._4_4_ = 1; x._4_4_ < 0x17; x._4_4_ = x._4_4_ + 1) {
    bVar2 = (byte)x._4_4_;
    if (FStack_18 < 0) {
      lVar3 = xtemp + (long)arctanptr >> (bVar2 & 0x3f);
      lVar4 = -(y + (long)arctanptr >> (bVar2 & 0x3f));
      lVar1 = *local_48;
    }
    else {
      lVar3 = -(xtemp + (long)arctanptr >> (bVar2 & 0x3f));
      lVar4 = y + (long)arctanptr >> (bVar2 & 0x3f);
      lVar1 = -*local_48;
    }
    FStack_18 = lVar1 + FStack_18;
    y = y + lVar3;
    xtemp = xtemp + lVar4;
    local_48 = local_48 + 1;
    arctanptr = (FT_Angle *)((long)arctanptr << 1);
  }
  vec->x = y;
  vec->y = xtemp;
  return;
}

Assistant:

static void
  ft_trig_pseudo_rotate( FT_Vector*  vec,
                         FT_Angle    theta )
  {
    FT_Int           i;
    FT_Fixed         x, y, xtemp, b;
    const FT_Angle  *arctanptr;


    x = vec->x;
    y = vec->y;

    /* Rotate inside [-PI/4,PI/4] sector */
    while ( theta < -FT_ANGLE_PI4 )
    {
      xtemp  =  y;
      y      = -x;
      x      =  xtemp;
      theta +=  FT_ANGLE_PI2;
    }

    while ( theta > FT_ANGLE_PI4 )
    {
      xtemp  = -y;
      y      =  x;
      x      =  xtemp;
      theta -=  FT_ANGLE_PI2;
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for ( i = 1, b = 1; i < FT_TRIG_MAX_ITERS; b <<= 1, i++ )
    {
      if ( theta < 0 )
      {
        xtemp  = x + ( ( y + b ) >> i );
        y      = y - ( ( x + b ) >> i );
        x      = xtemp;
        theta += *arctanptr++;
      }
      else
      {
        xtemp  = x - ( ( y + b ) >> i );
        y      = y + ( ( x + b ) >> i );
        x      = xtemp;
        theta -= *arctanptr++;
      }
    }

    vec->x = x;
    vec->y = y;
  }